

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O0

void __thiscall OpenMD::EvenConstraint::EvenConstraint(EvenConstraint *this)

{
  string *in_RDI;
  
  ParamConstraintFacade<OpenMD::EvenConstraint>::ParamConstraintFacade
            ((ParamConstraintFacade<OpenMD::EvenConstraint> *)0x360e88);
  std::__cxx11::string::operator=(in_RDI,"even");
  return;
}

Assistant:

EvenConstraint() { this->description_ = "even"; }